

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall
wabt::WastLexer::GetNameEqNumToken
          (Token *__return_storage_ptr__,WastLexer *this,string_view name,TokenType token_type)

{
  TokenType TVar1;
  bool bVar2;
  size_type sVar3;
  string_view local_48;
  WastLexer *local_38;
  char *local_30;
  TokenType local_24;
  WastLexer *pWStack_20;
  TokenType token_type_local;
  WastLexer *this_local;
  string_view name_local;
  
  local_30 = name._M_str;
  local_38 = (WastLexer *)name._M_len;
  local_24 = token_type;
  pWStack_20 = this;
  this_local = local_38;
  name_local._M_len = (size_t)local_30;
  bVar2 = MatchString(this,name);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"0x");
    bVar2 = MatchString(this,local_48);
    if (bVar2) {
      bVar2 = ReadHexNum(this);
      if ((bVar2) && (bVar2 = NoTrailingReservedChars(this), TVar1 = local_24, bVar2)) {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        TextToken(__return_storage_ptr__,this,TVar1,sVar3);
        return __return_storage_ptr__;
      }
    }
    else {
      bVar2 = ReadNum(this);
      if ((bVar2) && (bVar2 = NoTrailingReservedChars(this), TVar1 = local_24, bVar2)) {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        TextToken(__return_storage_ptr__,this,TVar1,sVar3);
        return __return_storage_ptr__;
      }
    }
  }
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNameEqNumToken(std::string_view name,
                                   TokenType token_type) {
  if (MatchString(name)) {
    if (MatchString("0x")) {
      if (ReadHexNum() && NoTrailingReservedChars()) {
        return TextToken(token_type, name.size());
      }
    } else if (ReadNum() && NoTrailingReservedChars()) {
      return TextToken(token_type, name.size());
    }
  }
  return GetKeywordToken();
}